

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O3

void hideOrShowWidgetsInLayout(QLayout *layout,bool on)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  QLayout *layout_00;
  
  iVar1 = (**(code **)(*(long *)layout + 200))();
  if (0 < iVar1) {
    iVar1 = 0;
    do {
      plVar3 = (long *)(**(code **)(*(long *)layout + 0xa8))(layout,iVar1);
      plVar4 = (long *)(**(code **)(*plVar3 + 0x68))(plVar3);
      if (plVar4 == (long *)0x0) {
        lVar5 = (**(code **)(*plVar3 + 0x70))(plVar3);
        if (lVar5 != 0) {
          layout_00 = (QLayout *)(**(code **)(*plVar3 + 0x70))(plVar3);
          hideOrShowWidgetsInLayout(layout_00,on);
        }
      }
      else {
        (**(code **)(*plVar4 + 0x68))(plVar4,on);
      }
      iVar1 = iVar1 + 1;
      iVar2 = (**(code **)(*(long *)layout + 200))(layout);
    } while (iVar1 < iVar2);
  }
  return;
}

Assistant:

static void hideOrShowWidgetsInLayout(QLayout *layout, bool on)
{
    for (int i = 0; i < layout->count(); ++i) {
        QLayoutItem *item = layout->itemAt(i);
        if (QWidget *widget = item->widget())
            widget->setVisible(on);
        else if (item->layout())
            hideOrShowWidgetsInLayout(item->layout(), on);
    }
}